

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

int av1_receive_compressed_data(AV1Decoder *pbi,size_t size,uint8_t **psource)

{
  byte bVar1;
  RefCntBuffer *pRVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  AVxWorkerInterface *pAVar6;
  uint8_t *puVar7;
  int *piVar8;
  pthread_mutex_t *ppVar9;
  ulong uVar10;
  long lVar11;
  RefCntBuffer **ppRVar12;
  uint uVar13;
  long lVar14;
  aom_codec_frame_buffer_t *paVar15;
  AV1_COMMON *cm;
  
  puVar7 = *psource;
  (pbi->error).error_code = AOM_CODEC_OK;
  (pbi->error).has_detail = 0;
  if (((size == 0) && (lVar14 = (long)(pbi->common).remapped_ref_idx[0], lVar14 != -1)) &&
     (pRVar2 = (pbi->common).ref_frame_map[lVar14], pRVar2 != (RefCntBuffer *)0x0)) {
    (pRVar2->buf).corrupted = 1;
  }
  pRVar2 = (pbi->common).cur_frame;
  if (pRVar2 != (RefCntBuffer *)0x0) {
    pRVar2->ref_count = pRVar2->ref_count + -1;
    (pbi->common).cur_frame = (RefCntBuffer *)0x0;
  }
  ppVar9 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  piVar3 = *(int **)((long)ppVar9 + 0x40);
  pthread_mutex_lock(ppVar9);
  ppVar9 = (pthread_mutex_t *)(pbi->common).buffer_pool;
  bVar1 = *(byte *)((long)ppVar9 + 0x48);
  if (bVar1 == 0) {
    uVar13 = 0;
LAB_001777d3:
    if (uVar13 != bVar1) {
      piVar8 = piVar3 + (ulong)uVar13 * 0x1638;
      if (piVar3[(ulong)uVar13 * 0x1638 + 0x148] != 0) {
        *(undefined8 *)(piVar8 + 0x142) = *(undefined8 *)(piVar8 + 0x14a);
        *(undefined8 *)(piVar8 + 0x144) = *(undefined8 *)(piVar8 + 0x14c);
        *(undefined8 *)(piVar8 + 0x146) = *(undefined8 *)(piVar8 + 0x14e);
        piVar8[0x148] = 0;
        ppVar9 = (pthread_mutex_t *)(pbi->common).buffer_pool;
      }
      *piVar8 = 1;
      pthread_mutex_unlock(ppVar9);
      if (uVar13 == 0xffffffff) goto LAB_001777dd;
      pRVar2 = ((pbi->common).buffer_pool)->frame_bufs;
      (pbi->common).cur_frame = pRVar2 + (int)uVar13;
      aom_invalidate_pyramid(pRVar2[(int)uVar13].buf.y_pyramid);
      av1_invalidate_corner_list((((pbi->common).cur_frame)->buf).corners);
      pRVar2 = (pbi->common).cur_frame;
      pRVar2->interp_filter_selected[0] = 0;
      pRVar2->interp_filter_selected[1] = 0;
      pRVar2->interp_filter_selected[2] = 0;
      pRVar2->interp_filter_selected[3] = 0;
      if ((pbi->common).cur_frame == (RefCntBuffer *)0x0) goto LAB_001777dd;
      iVar5 = _setjmp((__jmp_buf_tag *)(pbi->error).jmp);
      if (iVar5 != 0) {
        pAVar6 = aom_get_worker_interface();
        (pbi->error).setjmp = 0;
        (*pAVar6->sync)(&pbi->lf_worker);
        if (0 < pbi->num_workers) {
          lVar11 = 0;
          lVar14 = lVar11;
          do {
            (*pAVar6->sync)((AVxWorker *)((long)&pbi->tile_workers->impl_ + lVar11));
            lVar14 = lVar14 + 1;
            lVar11 = lVar11 + 0x38;
          } while (lVar14 < pbi->num_workers);
        }
        release_current_frame(pbi);
        return -1;
      }
      (pbi->error).setjmp = 1;
      iVar5 = aom_decode_frame_from_obus(pbi,puVar7,puVar7 + size,psource);
      if (iVar5 < 0) {
        release_current_frame(pbi);
        goto LAB_00177b79;
      }
      ppVar9 = (pthread_mutex_t *)(pbi->common).buffer_pool;
      pthread_mutex_lock(ppVar9);
      if (iVar5 == 0) {
LAB_00177a76:
        pRVar2 = (pbi->common).cur_frame;
        if ((pRVar2 != (RefCntBuffer *)0x0) &&
           ((pRVar2->ref_count = pRVar2->ref_count + -1, pRVar2->ref_count == 0 &&
            ((pRVar2->raw_frame_buffer).data != (uint8_t *)0x0)))) {
          paVar15 = &pRVar2->raw_frame_buffer;
          (**(code **)((long)ppVar9 + 0x38))(ppVar9[1].__align,paVar15);
          paVar15->data = (uint8_t *)0x0;
          paVar15->size = 0;
          (pRVar2->raw_frame_buffer).priv = (void *)0x0;
        }
      }
      else {
        if ((pbi->camera_frame_header_ready == 0) &&
           (uVar13 = (pbi->common).current_frame.refresh_frame_flags, uVar13 != 0)) {
          ppRVar12 = (pbi->common).ref_frame_map;
          do {
            if ((uVar13 & 1) != 0) {
              pRVar2 = *ppRVar12;
              if (((pRVar2 != (RefCntBuffer *)0x0) &&
                  (pRVar2->ref_count = pRVar2->ref_count + -1, pRVar2->ref_count == 0)) &&
                 ((pRVar2->raw_frame_buffer).data != (uint8_t *)0x0)) {
                paVar15 = &pRVar2->raw_frame_buffer;
                (**(code **)((long)ppVar9 + 0x38))(ppVar9[1].__align,paVar15);
                paVar15->data = (uint8_t *)0x0;
                paVar15->size = 0;
                (pRVar2->raw_frame_buffer).priv = (void *)0x0;
              }
              pRVar2 = (pbi->common).cur_frame;
              *ppRVar12 = pRVar2;
              pRVar2->ref_count = pRVar2->ref_count + 1;
            }
            ppRVar12 = ppRVar12 + 1;
            bVar4 = 1 < uVar13;
            uVar13 = (int)uVar13 >> 1;
          } while (bVar4);
        }
        if (((pbi->common).show_existing_frame == 0) && ((pbi->common).show_frame == 0))
        goto LAB_00177a76;
        uVar10 = pbi->num_output_frames;
        if (pbi->output_all_layers == 0) {
          if ((((uVar10 != 0) && (pRVar2 = pbi->output_frames[0], pRVar2 != (RefCntBuffer *)0x0)) &&
              (pRVar2->ref_count = pRVar2->ref_count + -1, pRVar2->ref_count == 0)) &&
             ((pRVar2->raw_frame_buffer).data != (uint8_t *)0x0)) {
            paVar15 = &pRVar2->raw_frame_buffer;
            (**(code **)((long)ppVar9 + 0x38))(ppVar9[1].__align,paVar15);
            paVar15->data = (uint8_t *)0x0;
            paVar15->size = 0;
            (pRVar2->raw_frame_buffer).priv = (void *)0x0;
          }
          pbi->output_frames[0] = (pbi->common).cur_frame;
          pbi->num_output_frames = 1;
        }
        else {
          pRVar2 = (pbi->common).cur_frame;
          if (uVar10 < 4) {
            pbi->output_frames[uVar10] = pRVar2;
            pbi->num_output_frames = uVar10 + 1;
          }
          else {
            (pRVar2->buf).corrupted = 1;
            pRVar2->ref_count = pRVar2->ref_count + -1;
            if ((pRVar2->ref_count == 0) && ((pRVar2->raw_frame_buffer).data != (uint8_t *)0x0)) {
              paVar15 = &pRVar2->raw_frame_buffer;
              (**(code **)((long)ppVar9 + 0x38))(ppVar9[1].__align,paVar15);
              paVar15->data = (uint8_t *)0x0;
              paVar15->size = 0;
              (pRVar2->raw_frame_buffer).priv = (void *)0x0;
            }
            (pbi->error).error_code = AOM_CODEC_UNSUP_BITSTREAM;
          }
        }
      }
      pthread_mutex_unlock(ppVar9);
      (pbi->common).cur_frame = (RefCntBuffer *)0x0;
      if (pbi->camera_frame_header_ready == 0) {
        (pbi->common).remapped_ref_idx[3] = -1;
        (pbi->common).remapped_ref_idx[4] = -1;
        (pbi->common).remapped_ref_idx[5] = -1;
        (pbi->common).remapped_ref_idx[6] = -1;
        (pbi->common).remapped_ref_idx[0] = -1;
        (pbi->common).remapped_ref_idx[1] = -1;
        (pbi->common).remapped_ref_idx[2] = -1;
        (pbi->common).remapped_ref_idx[3] = -1;
      }
      if (iVar5 != 0) {
        pbi->decoding_first_frame = 0;
      }
      if ((pbi->error).error_code == AOM_CODEC_OK) {
        if (((pbi->common).show_existing_frame == 0) && ((pbi->common).seg.enabled != '\0')) {
          if (((pbi->common).prev_frame == (RefCntBuffer *)0x0) ||
             (((pbi->common).mi_params.mi_rows != ((pbi->common).prev_frame)->mi_rows ||
              ((pbi->common).mi_params.mi_cols != ((pbi->common).prev_frame)->mi_cols)))) {
            puVar7 = (uint8_t *)0x0;
          }
          else {
            puVar7 = ((pbi->common).prev_frame)->seg_map;
          }
          (pbi->common).last_frame_seg_map = puVar7;
        }
        (pbi->error).setjmp = 0;
        return 0;
      }
LAB_00177b79:
      (pbi->error).setjmp = 0;
      return 1;
    }
  }
  else {
    uVar10 = 0;
    piVar8 = piVar3;
    do {
      if (*piVar8 == 0) {
        uVar13 = (uint)uVar10;
        goto LAB_001777d3;
      }
      uVar10 = uVar10 + 1;
      piVar8 = piVar8 + 0x1638;
    } while ((uint)bVar1 != uVar10);
  }
  pthread_mutex_unlock(ppVar9);
LAB_001777dd:
  (pbi->error).error_code = AOM_CODEC_MEM_ERROR;
  return 1;
}

Assistant:

int av1_receive_compressed_data(AV1Decoder *pbi, size_t size,
                                const uint8_t **psource) {
  AV1_COMMON *volatile const cm = &pbi->common;
  const uint8_t *source = *psource;
  pbi->error.error_code = AOM_CODEC_OK;
  pbi->error.has_detail = 0;

  if (size == 0) {
    // This is used to signal that we are missing frames.
    // We do not know if the missing frame(s) was supposed to update
    // any of the reference buffers, but we act conservative and
    // mark only the last buffer as corrupted.
    //
    // TODO(jkoleszar): Error concealment is undefined and non-normative
    // at this point, but if it becomes so, [0] may not always be the correct
    // thing to do here.
    RefCntBuffer *ref_buf = get_ref_frame_buf(cm, LAST_FRAME);
    if (ref_buf != NULL) ref_buf->buf.corrupted = 1;
  }

  if (assign_cur_frame_new_fb(cm) == NULL) {
    pbi->error.error_code = AOM_CODEC_MEM_ERROR;
    return 1;
  }

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(pbi->error.jmp)) {
    const AVxWorkerInterface *const winterface = aom_get_worker_interface();
    int i;

    pbi->error.setjmp = 0;

    // Synchronize all threads immediately as a subsequent decode call may
    // cause a resize invalidating some allocations.
    winterface->sync(&pbi->lf_worker);
    for (i = 0; i < pbi->num_workers; ++i) {
      winterface->sync(&pbi->tile_workers[i]);
    }

    release_current_frame(pbi);
    return -1;
  }

  pbi->error.setjmp = 1;

  int frame_decoded =
      aom_decode_frame_from_obus(pbi, source, source + size, psource);

  if (frame_decoded < 0) {
    assert(pbi->error.error_code != AOM_CODEC_OK);
    release_current_frame(pbi);
    pbi->error.setjmp = 0;
    return 1;
  }

#if TXCOEFF_TIMER
  cm->cum_txcoeff_timer += cm->txcoeff_timer;
  fprintf(stderr,
          "txb coeff block number: %d, frame time: %ld, cum time %ld in us\n",
          cm->txb_count, cm->txcoeff_timer, cm->cum_txcoeff_timer);
  cm->txcoeff_timer = 0;
  cm->txb_count = 0;
#endif

  // Note: At this point, this function holds a reference to cm->cur_frame
  // in the buffer pool. This reference is consumed by update_frame_buffers().
  update_frame_buffers(pbi, frame_decoded);

  if (frame_decoded) {
    pbi->decoding_first_frame = 0;
  }

  if (pbi->error.error_code != AOM_CODEC_OK) {
    pbi->error.setjmp = 0;
    return 1;
  }

  if (!cm->show_existing_frame) {
    if (cm->seg.enabled) {
      if (cm->prev_frame &&
          (cm->mi_params.mi_rows == cm->prev_frame->mi_rows) &&
          (cm->mi_params.mi_cols == cm->prev_frame->mi_cols)) {
        cm->last_frame_seg_map = cm->prev_frame->seg_map;
      } else {
        cm->last_frame_seg_map = NULL;
      }
    }
  }

  // Update progress in frame parallel decode.
  pbi->error.setjmp = 0;

  return 0;
}